

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 total_data_size;
  OPJ_BYTE *p_data;
  OPJ_BOOL OVar1;
  OPJ_UINT32 total_data_size_00;
  OPJ_SIZE_T OVar2;
  ulong uVar3;
  OPJ_UINT32 l_available_data;
  OPJ_UINT32 l_tile_size;
  OPJ_BYTE *l_current_data;
  opj_event_mgr_t *poStack_28;
  OPJ_UINT32 l_nb_bytes_written;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  poStack_28 = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if ((p_j2k->m_specific_param).m_encoder.m_encoded_tile_data != (OPJ_BYTE *)0x0) {
    total_data_size = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
    p_data = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
    l_current_data._4_4_ = 0;
    OVar1 = opj_j2k_write_first_tile_part
                      (p_j2k,p_data,(OPJ_UINT32 *)((long)&l_current_data + 4),total_data_size,
                       p_stream,p_manager);
    if (OVar1 == 0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      uVar3 = (ulong)l_current_data._4_4_;
      total_data_size_00 = total_data_size - l_current_data._4_4_;
      l_current_data._4_4_ = 0;
      OVar1 = opj_j2k_write_all_tile_parts
                        ((opj_j2k_t *)p_stream_local,p_data + uVar3,
                         (OPJ_UINT32 *)((long)&l_current_data + 4),total_data_size_00,
                         (opj_stream_private_t *)p_manager_local,poStack_28);
      if (OVar1 == 0) {
        p_j2k_local._4_4_ = 0;
      }
      else {
        l_current_data._4_4_ = total_data_size - (total_data_size_00 - l_current_data._4_4_);
        OVar2 = opj_stream_write_data
                          ((opj_stream_private_t *)p_manager_local,
                           (OPJ_BYTE *)p_stream_local->m_seek_fn,(ulong)l_current_data._4_4_,
                           poStack_28);
        if (OVar2 == l_current_data._4_4_) {
          *(int *)&p_stream_local[2].m_seek_fn = *(int *)&p_stream_local[2].m_seek_fn + 1;
          p_j2k_local._4_4_ = 1;
        }
        else {
          p_j2k_local._4_4_ = 0;
        }
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x2d30,
                "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}